

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl(TraverseSchema *this,DOMElement *elem)

{
  short *psVar1;
  SchemaInfo *pSVar2;
  XMLStringPool *pXVar3;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  XMLCh *toCheck;
  DOMElement *pDVar7;
  undefined4 extraout_var;
  XMLCh *sysId;
  undefined4 extraout_var_00;
  XMLNotationDecl *this_01;
  XSAnnotation *annotation;
  long lVar9;
  NamespaceScopeManager nsMgr;
  XMLCh *local_48;
  NamespaceScopeManager local_40;
  long *plVar8;
  
  pSVar2 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar2;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x24,this,true,this->fNonXSAttList);
  toCheck = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((toCheck == (XMLCh *)0x0) || (*toCheck == L'\0')) {
    toCheck = (XMLCh *)0x0;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x55,L"notation",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    lVar9 = 2;
    do {
      psVar1 = (short *)((long)toCheck + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    bVar4 = XMLChar1_0::isValidNCName(toCheck,(lVar9 >> 1) - 1);
    if (bVar4) {
      bVar4 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                        (this->fNotationRegistry,toCheck,this->fTargetNSURI);
      if (!bVar4) {
        pDVar7 = XUtil::getFirstChildElement(&elem->super_DOMNode);
        pDVar7 = checkContent(this,elem,pDVar7,true,true);
        if (pDVar7 != (DOMElement *)0x0) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x4d);
        }
        iVar5 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_PUBLIC);
        plVar8 = (long *)CONCAT44(extraout_var,iVar5);
        if (plVar8 == (long *)0x0) {
          local_48 = (XMLCh *)0x0;
        }
        else {
          local_48 = (XMLCh *)(**(code **)(*plVar8 + 0x150))(plVar8);
        }
        sysId = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SYSTEM,AnyURI);
        pXVar3 = this->fStringPool;
        this_00 = this->fNotationRegistry;
        uVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,toCheck);
        iVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar6);
        RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                  (this_00,(void *)CONCAT44(extraout_var_00,iVar5),this->fTargetNSURI,
                   (char16_t *)0x0);
        this_01 = (XMLNotationDecl *)XMemory::operator_new(0x40,this->fGrammarPoolMemoryManager);
        XMLNotationDecl::XMLNotationDecl
                  (this_01,toCheck,local_48,sysId,(XMLCh *)0x0,this->fGrammarPoolMemoryManager);
        this_01->fNameSpaceId = this->fTargetNSURI;
        (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x12])
                  (this->fSchemaGrammar,this_01);
        if (this->fAnnotation == (XSAnnotation *)0x0) {
          if ((this->fScanner->fGenerateSyntheticAnnotations == true) &&
             (this->fNonXSAttList->fCurCount != 0)) {
            annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
            this->fAnnotation = annotation;
            SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,annotation);
          }
        }
        else {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,this->fAnnotation);
        }
      }
    }
    else {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"notation",
                        toCheck,(XMLCh *)0x0,(XMLCh *)0x0);
      toCheck = (XMLCh *)0x0;
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return toCheck;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Notation, this, true, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Process notation attributes/elements
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool         nameEmpty = (!name || !*name) ? true : false;

    if (nameEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
                          SchemaSymbols::fgELT_NOTATION);
        return 0;
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_NOTATION, name);
        return 0;
    }

    if (fNotationRegistry->containsKey(name, fTargetNSURI)) {
        return name;
    }

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    const XMLCh* publicId = getElementAttValue(elem, SchemaSymbols::fgATT_PUBLIC);
    const XMLCh* systemId = getElementAttValue(elem, SchemaSymbols::fgATT_SYSTEM, DatatypeValidator::AnyURI);

    fNotationRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)),
                           fTargetNSURI, 0);

    // for PSVI we need to store the notational decl
    XMLNotationDecl* decl = new (fGrammarPoolMemoryManager) XMLNotationDecl
        (
            name,
            publicId,
            systemId,
            0,
            fGrammarPoolMemoryManager
        );
    decl->setNameSpaceId(fTargetNSURI);
    fSchemaGrammar->putNotationDecl(decl);

    if (fAnnotation)
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    }
    return name;
}